

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlACatalogRemove(xmlCatalogPtr catal,xmlChar *value)

{
  xmlCatalogEntryPtr catal_00;
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  _xmlCatalogEntry *p_Var4;
  
  iVar2 = -1;
  if (value != (xmlChar *)0x0 && catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      catal_00 = catal->xml;
      if ((catal_00 != (xmlCatalogEntryPtr)0x0) && ((uint)(catal_00->type + XML_CATA_REMOVED) < 2))
      {
        if (catal_00->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal_00);
        }
        p_Var4 = (_xmlCatalogEntry *)&catal_00->children;
        iVar2 = 0;
        while (p_Var4 = p_Var4->next, p_Var4 != (_xmlCatalogEntry *)0x0) {
          if (((p_Var4->name != (xmlChar *)0x0) &&
              (iVar1 = xmlStrEqual(value,p_Var4->name), iVar1 != 0)) ||
             (iVar1 = xmlStrEqual(value,p_Var4->value), iVar1 != 0)) {
            if (xmlDebugCatalogs != 0) {
              pxVar3 = p_Var4->name;
              if (pxVar3 == (xmlChar *)0x0) {
                pxVar3 = p_Var4->value;
              }
              xmlCatalogPrintDebug("Removing element %s from catalog\n",pxVar3);
            }
            p_Var4->type = XML_CATA_REMOVED;
          }
        }
      }
    }
    else {
      iVar2 = xmlHashRemoveEntry(catal->sgml,value,xmlFreeCatalogEntry);
      iVar2 = iVar2 + (uint)(iVar2 == 0);
    }
  }
  return iVar2;
}

Assistant:

int
xmlACatalogRemove(xmlCatalogPtr catal, const xmlChar *value) {
    int res = -1;

    if ((catal == NULL) || (value == NULL))
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	res = xmlDelXMLCatalog(catal->xml, value);
    } else {
	res = xmlHashRemoveEntry(catal->sgml, value, xmlFreeCatalogEntry);
	if (res == 0)
	    res = 1;
    }
    return(res);
}